

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O0

void __thiscall
btStaticPlaneShape::processAllTriangles
          (btStaticPlaneShape *this,btTriangleCallback *callback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  long *in_RSI;
  long in_RDI;
  btScalar bVar1;
  btVector3 bVar2;
  btVector3 triangle [3];
  btVector3 projectedCenter;
  btVector3 supVertex1;
  btVector3 supVertex0;
  btVector3 tangentDir1;
  btVector3 tangentDir0;
  btVector3 center;
  btScalar radius;
  btVector3 halfExtents;
  btVector3 *in_stack_fffffffffffffd18;
  btScalar *in_stack_fffffffffffffd20;
  btVector3 *in_stack_fffffffffffffd28;
  btVector3 *v2;
  btVector3 *in_stack_fffffffffffffd30;
  btVector3 *pbVar3;
  btVector3 *in_stack_fffffffffffffd70;
  btVector3 *in_stack_fffffffffffffd78;
  btVector3 *in_stack_fffffffffffffd80;
  btVector3 local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 auStack_d8 [20];
  undefined8 local_c4;
  undefined8 local_bc;
  undefined8 local_b4;
  btVector3 local_ac;
  btVector3 local_9c;
  btVector3 local_8c;
  btVector3 local_7c;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  btVector3 local_58;
  btVector3 local_48;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long *local_10;
  
  local_10 = in_RSI;
  bVar2 = operator-(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_38 = bVar2.m_floats._8_8_;
  local_48.m_floats._8_8_ = bVar2.m_floats._0_8_;
  local_48.m_floats[1] = 0.5;
  bVar2 = ::operator*(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28->m_floats);
  local_28 = bVar2.m_floats._8_8_;
  local_30 = bVar2.m_floats._0_8_;
  local_48.m_floats[0] = btVector3::length((btVector3 *)0x1c4c0a);
  bVar2 = operator+(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_60 = bVar2.m_floats._8_8_;
  local_68 = bVar2.m_floats._0_8_;
  local_6c = 0x3f000000;
  bVar2 = ::operator*(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28->m_floats);
  local_58.m_floats._8_8_ = bVar2.m_floats._8_8_;
  local_58.m_floats._0_8_ = bVar2.m_floats._0_8_;
  btVector3::btVector3(&local_7c);
  btVector3::btVector3(&local_8c);
  btPlaneSpace1<btVector3>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  btVector3::btVector3(&local_9c);
  btVector3::btVector3(&local_ac);
  bVar1 = btVector3::dot((btVector3 *)(in_RDI + 0x40),&local_58);
  auStack_d8._8_4_ = bVar1 - *(float *)(in_RDI + 0x50);
  bVar2 = ::operator*(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_c4 = bVar2.m_floats._8_8_;
  auStack_d8._12_8_ = bVar2.m_floats._0_8_;
  bVar2 = operator-(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_b4 = bVar2.m_floats._8_8_;
  local_bc = bVar2.m_floats._0_8_;
  pbVar3 = &local_108;
  do {
    btVector3::btVector3(pbVar3);
    pbVar3 = pbVar3 + 1;
  } while (pbVar3 != (btVector3 *)auStack_d8);
  pbVar3 = &local_48;
  ::operator*(pbVar3,in_stack_fffffffffffffd28->m_floats);
  operator+(pbVar3,in_stack_fffffffffffffd28);
  v2 = &local_8c;
  ::operator*(pbVar3,v2->m_floats);
  bVar2 = operator+(pbVar3,v2);
  local_108.m_floats._8_8_ = bVar2.m_floats._8_8_;
  local_108.m_floats._0_8_ = bVar2.m_floats._0_8_;
  ::operator*(pbVar3,v2->m_floats);
  operator+(pbVar3,v2);
  ::operator*(pbVar3,v2->m_floats);
  bVar2 = operator-(pbVar3,v2);
  uStack_f0 = bVar2.m_floats._8_8_;
  local_f8 = bVar2.m_floats._0_8_;
  ::operator*(pbVar3,v2->m_floats);
  operator-(pbVar3,v2);
  ::operator*(pbVar3,v2->m_floats);
  bVar2 = operator-(pbVar3,v2);
  local_e8 = bVar2.m_floats._0_8_;
  uStack_e0 = bVar2.m_floats._8_8_;
  (**(code **)(*local_10 + 0x10))(local_10,&local_108,0);
  ::operator*(pbVar3,v2->m_floats);
  operator-(pbVar3,v2);
  ::operator*(pbVar3,v2->m_floats);
  bVar2 = operator-(pbVar3,v2);
  local_108.m_floats._8_8_ = bVar2.m_floats._8_8_;
  local_108.m_floats._0_8_ = bVar2.m_floats._0_8_;
  ::operator*(pbVar3,v2->m_floats);
  operator-(pbVar3,v2);
  ::operator*(pbVar3,v2->m_floats);
  bVar2 = operator+(pbVar3,v2);
  uStack_f0 = bVar2.m_floats._8_8_;
  local_f8 = bVar2.m_floats._0_8_;
  ::operator*(pbVar3,v2->m_floats);
  operator+(pbVar3,v2);
  ::operator*(pbVar3,v2->m_floats);
  bVar2 = operator+(pbVar3,v2);
  uStack_e0 = bVar2.m_floats._8_8_;
  local_e8 = bVar2.m_floats._0_8_;
  (**(code **)(*local_10 + 0x10))(local_10,&local_108,0,1);
  return;
}

Assistant:

void	btStaticPlaneShape::processAllTriangles(btTriangleCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{

	btVector3 halfExtents = (aabbMax - aabbMin) * btScalar(0.5);
	btScalar radius = halfExtents.length();
	btVector3 center = (aabbMax + aabbMin) * btScalar(0.5);
	
	//this is where the triangles are generated, given AABB and plane equation (normal/constant)

	btVector3 tangentDir0,tangentDir1;

	//tangentDir0/tangentDir1 can be precalculated
	btPlaneSpace1(m_planeNormal,tangentDir0,tangentDir1);

	btVector3 supVertex0,supVertex1;

	btVector3 projectedCenter = center - (m_planeNormal.dot(center) - m_planeConstant)*m_planeNormal;
	
	btVector3 triangle[3];
	triangle[0] = projectedCenter + tangentDir0*radius + tangentDir1*radius;
	triangle[1] = projectedCenter + tangentDir0*radius - tangentDir1*radius;
	triangle[2] = projectedCenter - tangentDir0*radius - tangentDir1*radius;

	callback->processTriangle(triangle,0,0);

	triangle[0] = projectedCenter - tangentDir0*radius - tangentDir1*radius;
	triangle[1] = projectedCenter - tangentDir0*radius + tangentDir1*radius;
	triangle[2] = projectedCenter + tangentDir0*radius + tangentDir1*radius;

	callback->processTriangle(triangle,0,1);

}